

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

void __thiscall merlin::factor::factor(factor *this,value s)

{
  allocator<double> local_19;
  value local_18;
  value s_local;
  factor *this_local;
  
  this->_vptr_factor = (_func_int **)&PTR__factor_002973f8;
  local_18 = s;
  s_local = (value)this;
  variable_set::variable_set(&this->v_);
  std::allocator<double>::allocator(&local_19);
  std::vector<double,_std::allocator<double>_>::vector(&this->t_,1,&local_18,&local_19);
  std::allocator<double>::~allocator(&local_19);
  this->c_ = -1;
  return;
}

Assistant:

factor(const value s = 1.0) :
			v_(), t_(1, s), c_(-1) {
	}